

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O3

QMultiMap<int,_QString> __thiscall QFactoryLoader::keyMap(QFactoryLoader *this)

{
  QCborContainerPrivate *pQVar1;
  qsizetype qVar2;
  QFactoryLoader *in_RSI;
  long lVar3;
  long in_FS_OFFSET;
  QString local_a8;
  QString local_88;
  QCborValueConstRef local_70;
  int local_5c;
  QArrayDataPointer<QCborArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).iid.d.d = (Data *)0x0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys((QList<QCborArray> *)&local_58,in_RSI);
  local_5c = 0;
  if (0 < (int)local_58.size) {
    do {
      pQVar1 = local_58.ptr[local_5c].d.d.ptr;
      qVar2 = QCborArray::size(local_58.ptr + local_5c);
      if (qVar2 != 0) {
        lVar3 = 0;
        do {
          local_a8.d.d = (Data *)0x0;
          local_a8.d.ptr = (char16_t *)0x0;
          local_a8.d.size = 0;
          local_70.d = pQVar1;
          local_70.i = lVar3;
          QCborValueConstRef::toString(&local_88,&local_70,&local_a8);
          QMultiMap<int,_QString>::insert((QMultiMap<int,_QString> *)this,&local_5c,&local_88);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          lVar3 = lVar3 + 1;
        } while (qVar2 != lVar3);
      }
      local_5c = local_5c + 1;
    } while (local_5c < (int)local_58.size);
  }
  QArrayDataPointer<QCborArray>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMultiMap<int, QString> QFactoryLoader::keyMap() const
{
    QMultiMap<int, QString> result;
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys)
            result.insert(i, key.toString());
    }
    return result;
}